

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

Decoration __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::TranslateInterpolationDecoration
          (TGlslangToSpvTraverser *this,TQualifier *qualifier)

{
  ulong uVar1;
  Decoration DVar2;
  
  uVar1 = *(ulong *)&qualifier->field_0x8;
  if (((uint)uVar1 >> 0x1e & 1) != 0) {
    return DecorationMax;
  }
  if ((uVar1 >> 0x25 & 1) == 0) {
    if (-1 < (int)(uint)uVar1) {
      if ((uVar1 >> 0x26 & 1) == 0) {
        return DecorationMax;
      }
      spv::Builder::addExtension(&this->builder,"SPV_AMD_shader_explicit_vertex_parameter");
      return DecorationExplicitInterpAMD;
    }
    DVar2 = DecorationFlat;
  }
  else {
    DVar2 = DecorationNoPerspective;
  }
  return DVar2;
}

Assistant:

spv::Decoration TGlslangToSpvTraverser::TranslateInterpolationDecoration(const glslang::TQualifier& qualifier)
{
    if (qualifier.smooth)
        // Smooth decoration doesn't exist in SPIR-V 1.0
        return spv::DecorationMax;
    else if (qualifier.isNonPerspective())
        return spv::DecorationNoPerspective;
    else if (qualifier.flat)
        return spv::DecorationFlat;
    else if (qualifier.isExplicitInterpolation()) {
        builder.addExtension(spv::E_SPV_AMD_shader_explicit_vertex_parameter);
        return spv::DecorationExplicitInterpAMD;
    }
    else
        return spv::DecorationMax;
}